

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O0

uintptr_t ht_feature_cached_string_add_mapping_dynamic(HT_Timeline *timeline,char *label)

{
  uint32_t uVar1;
  HT_FeatureCachedString *pHVar2;
  ulong key;
  char *pcVar3;
  size_t __n;
  char *new_label;
  size_t label_len;
  uintptr_t hash_value;
  HT_FeatureCachedString *f;
  char *label_local;
  HT_Timeline *timeline_local;
  
  pHVar2 = HT_FeatureCachedString_from_timeline(timeline);
  if (pHVar2 == (HT_FeatureCachedString *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O0/hawktracer.cpp"
                  ,0x989,
                  "uintptr_t ht_feature_cached_string_add_mapping_dynamic(HT_Timeline *, const char *)"
                 );
  }
  uVar1 = djb2_hash(label);
  key = (ulong)uVar1;
  if (pHVar2->lock != (HT_Mutex *)0x0) {
    ht_mutex_lock(pHVar2->lock);
  }
  pcVar3 = ht_hash_map_get_value(&pHVar2->dynamic_hashes,key);
  if (pcVar3 == (char *)0x0) {
    if (pHVar2->lock != (HT_Mutex *)0x0) {
      ht_mutex_unlock(pHVar2->lock);
    }
    __n = strlen(label);
    pcVar3 = (char *)ht_alloc(__n + 1);
    memcpy(pcVar3,label,__n);
    pcVar3[__n] = '\0';
    ht_feature_cached_string_add_mapping_(timeline,&pHVar2->dynamic_hashes,key,pcVar3);
  }
  else if (pHVar2->lock != (HT_Mutex *)0x0) {
    ht_mutex_unlock(pHVar2->lock);
  }
  return key;
}

Assistant:

uintptr_t
ht_feature_cached_string_add_mapping_dynamic(HT_Timeline* timeline, const char* label)
{
    HT_FeatureCachedString* f = HT_FeatureCachedString_from_timeline(timeline);
    uintptr_t hash_value;

    assert(f);

    hash_value = djb2_hash(label);

    HT_FCS_LOCK_(f);

    if (ht_hash_map_get_value(&f->dynamic_hashes, hash_value) == NULL)
    {
        HT_FCS_UNLOCK_(f);

        size_t label_len = strlen(label);
        char* new_label = (char*)ht_alloc(label_len + 1);
        memcpy(new_label, label, label_len);
        new_label[label_len] = 0;

        ht_feature_cached_string_add_mapping_(timeline, &f->dynamic_hashes, hash_value, new_label);
    }
    else
    {
        HT_FCS_UNLOCK_(f);
    }

    return hash_value;
}